

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O1

uchar * Gia_WriteEquivClassesInt(Gia_Man_t *p,int *pEquivSize)

{
  uint *puVar1;
  Gia_Rpr_t *pGVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  uchar *puVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uchar *puVar12;
  size_t __size;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  byte *pbVar16;
  ulong uVar17;
  
  pGVar2 = p->pReprs;
  if ((pGVar2 == (Gia_Rpr_t *)0x0) || (piVar3 = p->pNexts, piVar3 == (int *)0x0)) {
    __assert_fail("p->pReprs && p->pNexts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAigerExt.c"
                  ,0x4f,"unsigned char *Gia_WriteEquivClassesInt(Gia_Man_t *, int *)");
  }
  iVar7 = p->nObjs;
  uVar17 = (ulong)iVar7;
  __size = 0x28;
  if (1 < (long)uVar17) {
    iVar5 = 0;
    uVar8 = 1;
    do {
      iVar5 = iVar5 + (uint)(((uint)pGVar2[uVar8] & 0xfffffff) == 0);
      if ((((uint)pGVar2[uVar8] & 0xfffffff) == 0xfffffff) && (0 < piVar3[uVar8])) {
        if (piVar3[uVar8] < 1) {
          __assert_fail("Gia_ObjIsHead(p, iRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAigerExt.c"
                        ,0x57,"unsigned char *Gia_WriteEquivClassesInt(Gia_Man_t *, int *)");
        }
        uVar10 = uVar8 & 0xffffffff;
        do {
          iVar5 = iVar5 + 1;
          puVar1 = (uint *)(piVar3 + uVar10);
          uVar10 = (ulong)*puVar1;
        } while (0 < (int)*puVar1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar17);
    __size = (long)iVar5 * 4 + 0x28;
  }
  puVar6 = (uchar *)malloc(__size);
  puVar6[4] = '\x01';
  iVar5 = 5;
  if (1 < iVar7) {
    iVar13 = 0;
    iVar5 = 5;
    uVar8 = 1;
    do {
      if (((uint)pGVar2[uVar8] & 0xfffffff) == 0) {
        iVar13 = (int)uVar8 - iVar13;
        if (iVar13 < 0) goto LAB_001d5895;
        uVar9 = ((uint)pGVar2[uVar8] >> 0x1b & 2) + iVar13 * 4;
        if (0x7f < (uint)(iVar13 * 4)) {
          pbVar16 = puVar6 + iVar5;
          uVar14 = uVar9;
          do {
            *pbVar16 = (byte)uVar14 | 0x80;
            uVar9 = uVar14 >> 7;
            pbVar16 = pbVar16 + 1;
            iVar5 = iVar5 + 1;
            bVar4 = 0x3fff < uVar14;
            uVar14 = uVar9;
          } while (bVar4);
        }
        lVar11 = (long)iVar5;
        iVar5 = iVar5 + 1;
        puVar6[lVar11] = (uchar)uVar9;
        iVar13 = (int)uVar8;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar17);
  }
  if (1 < iVar7) {
    iVar7 = 0;
    uVar8 = 1;
    do {
      if ((((uint)pGVar2[uVar8] & 0xfffffff) == 0xfffffff) && (0 < piVar3[uVar8])) {
        iVar13 = (int)uVar8;
        uVar9 = iVar13 - iVar7;
        if ((int)uVar9 < 0) {
LAB_001d5895:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar10 = (ulong)(uVar9 * 2 + 1);
        if (0x3f < uVar9) {
          pbVar16 = puVar6 + iVar5;
          do {
            uVar9 = (uint)uVar10;
            *pbVar16 = (byte)uVar10 | 0x80;
            uVar10 = uVar10 >> 7;
            pbVar16 = pbVar16 + 1;
            iVar5 = iVar5 + 1;
          } while (0x3fff < uVar9);
        }
        puVar6[iVar5] = (uchar)uVar10;
        if (piVar3[uVar8] < 1) {
          __assert_fail("Gia_ObjIsHead(p, iRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAigerExt.c"
                        ,0x6b,"unsigned char *Gia_WriteEquivClassesInt(Gia_Man_t *, int *)");
        }
        iVar5 = iVar5 + 1;
        uVar9 = piVar3[uVar8];
        iVar7 = iVar13;
        if (0 < (int)uVar9) {
          uVar10 = uVar8 & 0xffffffff;
          do {
            iVar13 = uVar9 - (int)uVar10;
            if (iVar13 < 0) goto LAB_001d5895;
            uVar10 = (ulong)uVar9;
            uVar15 = (ulong)(((uint)pGVar2[uVar9] >> 0x1b & 2) + iVar13 * 4);
            if (0x7f < (uint)(iVar13 * 4)) {
              pbVar16 = puVar6 + iVar5;
              do {
                uVar14 = (uint)uVar15;
                *pbVar16 = (byte)uVar15 | 0x80;
                uVar15 = uVar15 >> 7;
                pbVar16 = pbVar16 + 1;
                iVar5 = iVar5 + 1;
              } while (0x3fff < uVar14);
            }
            puVar6[iVar5] = (uchar)uVar15;
            iVar5 = iVar5 + 1;
            uVar9 = piVar3[uVar9];
          } while (0 < (int)uVar9);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar17);
  }
  iVar7 = 0x18;
  puVar12 = puVar6;
  do {
    *puVar12 = (uchar)(iVar5 >> ((byte)iVar7 & 0x1f));
    puVar12 = puVar12 + 1;
    iVar7 = iVar7 + -8;
  } while (iVar7 != -8);
  *pEquivSize = iVar5;
  return puVar6;
}

Assistant:

unsigned char * Gia_WriteEquivClassesInt( Gia_Man_t * p, int * pEquivSize )
{
    unsigned char * pBuffer;
    int iRepr, iNode, iPrevRepr, iPrevNode, iLit, nItems, iPos;
    assert( p->pReprs && p->pNexts );
    // count the number of entries to be written
    nItems = 0;
    for ( iRepr = 1; iRepr < Gia_ManObjNum(p); iRepr++ )
    {
        nItems += Gia_ObjIsConst( p, iRepr );
        if ( !Gia_ObjIsHead(p, iRepr) )
            continue;
        Gia_ClassForEachObj( p, iRepr, iNode )
            nItems++;
    }
    pBuffer = ABC_ALLOC( unsigned char, sizeof(int) * (nItems + 10) );
    // write constant class
    iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, 4, Abc_Var2Lit(0, 1) );
    iPrevNode = 0;
    for ( iNode = 1; iNode < Gia_ManObjNum(p); iNode++ )
        if ( Gia_ObjIsConst(p, iNode) )
        {
            iLit = Abc_Var2Lit( iNode - iPrevNode, Gia_ObjProved(p, iNode) );
            iPrevNode = iNode;
            iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Abc_Var2Lit(iLit, 0) );
        }
    // write non-constant classes
    iPrevRepr = 0;
    Gia_ManForEachClass( p, iRepr )
    {
        iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Abc_Var2Lit(iRepr - iPrevRepr, 1) );
        iPrevRepr = iPrevNode = iRepr;
        Gia_ClassForEachObj1( p, iRepr, iNode )
        {
            iLit = Abc_Var2Lit( iNode - iPrevNode, Gia_ObjProved(p, iNode) );
            iPrevNode = iNode;
            iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Abc_Var2Lit(iLit, 0) );
        }
    }
    Gia_AigerWriteInt( pBuffer, iPos );
    *pEquivSize = iPos;
    return pBuffer;
}